

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBox::setCurrentText(QComboBox *this,QString *text)

{
  bool bVar1;
  QFlags<Qt::MatchFlag> QVar2;
  int iVar3;
  QComboBox *in_RSI;
  QComboBox *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffec;
  QComboBox *this_00;
  
  this_00 = in_RDI;
  bVar1 = isEditable(in_RDI);
  if (bVar1) {
    setEditText(this_00,(QString *)in_RSI);
  }
  else {
    QVar2 = Qt::operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
    iVar3 = findText(in_RSI,(QString *)
                            CONCAT44(in_stack_ffffffffffffffec,
                                     QVar2.super_QFlagsStorageHelper<Qt::MatchFlag,_4>.
                                     super_QFlagsStorage<Qt::MatchFlag>.i),
                     (QFlagsStorageHelper<Qt::MatchFlag,_4>)SUB84((ulong)this_00 >> 0x20,0));
    if (-1 < iVar3) {
      setCurrentIndex(this_00,(int)((ulong)in_RSI >> 0x20));
    }
  }
  return;
}

Assistant:

void QComboBox::setCurrentText(const QString &text)
{
    if (isEditable()) {
        setEditText(text);
    } else {
        const int i = findText(text);
        if (i > -1)
            setCurrentIndex(i);
    }
}